

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase211::run(TestCase211 *this)

{
  Fault FVar1;
  Fault FVar2;
  int iVar3;
  Orphanage OVar4;
  uint local_17c;
  Builder root;
  Builder local_150;
  Fault f;
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar4 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::initText((OrphanBuilder *)&root,OVar4.arena,OVar4.capTable,8);
  orphan.builder.capTable = (CapTableBuilder *)root._builder.data;
  orphan.builder.location = (word *)root._builder.pointers;
  orphan.builder.tag.content = (uint64_t)root._builder.segment;
  orphan.builder.segment = (SegmentBuilder *)root._builder.capTable;
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  if (root._builder.data == (void *)0x9) {
    OrphanBuilder::asText((Builder *)&root,&orphan.builder);
    ((root._builder.capTable)->super_CapTableReader)._vptr_CapTableReader =
         (_func_int **)0x3837363534333231;
    MessageBuilder::getRootInternal(&local_150,&builder.super_MessageBuilder);
    f.exception = (Exception *)local_150.builder.segment;
    PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&f,(StructSize)0x140006);
    f.exception = (Exception *)root._builder.segment;
    PointerBuilder::adopt((PointerBuilder *)&f,&orphan.builder);
    f.exception = (Exception *)root._builder.segment;
    PointerBuilder::getBlob<capnp::Text>((Builder *)&local_150,(PointerBuilder *)&f,(void *)0x0,0);
    FVar2.exception = (Exception *)root._builder.segment;
    FVar1 = f;
    if (((local_150.builder.pointer != (WirePointer *)0x9) ||
        (iVar3 = bcmp(local_150.builder.capTable,"12345678",8), FVar1 = f,
        FVar2.exception = (Exception *)root._builder.segment, iVar3 != 0)) &&
       (f.exception = FVar2.exception, kj::_::Debug::minSeverity < 3)) {
      PointerBuilder::getBlob<capnp::Text>((Builder *)&local_150,(PointerBuilder *)&f,(void *)0x0,0)
      ;
      kj::_::Debug::log<char_const(&)[55],char_const(&)[9],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(\\\"12345678\\\") == (root.getTextField())\", \"12345678\", root.getTextField()"
                 ,(char (*) [55])"failed: expected (\"12345678\") == (root.getTextField())",
                 (char (*) [9])"12345678",(Builder *)&local_150);
      FVar1 = f;
    }
    f.exception = FVar1.exception;
    if (orphan.builder.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&orphan.builder);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_17c = 8;
  OrphanBuilder::asText((Builder *)&root,&orphan.builder);
  local_150.builder.segment = (SegmentBuilder *)((long)root._builder.data + -1);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xd7,FAILED,"(8u) == (orphan.get().size())","8u, orphan.get().size()",&local_17c,
             (unsigned_long *)&local_150);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Orphans, OrphanageText) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphan<Text>(8);
  ASSERT_EQ(8u, orphan.get().size());
  memcpy(orphan.get().begin(), "12345678", 8);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
  EXPECT_EQ("12345678", root.getTextField());
}